

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

void __thiscall soplex::SPxFastRT<double>::setType(SPxFastRT<double> *this,Type type)

{
  ulong uVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_SPxRatioTester<double>).m_type = type;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,
             &(this->super_SPxRatioTester<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar1 = -(ulong)((local_20._M_ptr)->s_epsilon_multiplier == 1.0);
  this->minStab =
       (double)(~uVar1 & (ulong)((local_20._M_ptr)->s_epsilon_multiplier * 1e-05) |
               uVar1 & 0x3ee4f8b588e368f1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  this->fastDelta = (this->super_SPxRatioTester<double>).delta;
  return;
}

Assistant:

void SPxFastRT<R>::setType(typename SPxSolverBase<R>::Type type)
{
   this->m_type = type;

   minStab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB);
   fastDelta = this->delta;
}